

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O0

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_>::weight_from_cos
          (PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_> *this,PolarExtentCoreContext *ctx,
          batch cos_angle)

{
  bool bVar1;
  batch *extraout_RAX;
  batch *extraout_RAX_00;
  batch *pbVar2;
  long in_RSI;
  simd_register<float,_xsimd::avx> sVar3;
  simd_register<float,_xsimd::avx> sVar4;
  batch<float,_xsimd::fma3<xsimd::avx2>_> ramp;
  batch_bool<float,_xsimd::fma3<xsimd::avx2>_> end;
  batch_bool<float,_xsimd::fma3<xsimd::avx2>_> start;
  batch<float,_xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffde0;
  batch<float,_xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffde8;
  batch_bool<float,_xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffdf0;
  batch<float,_xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffe08;
  batch<float,_xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  float val;
  batch<float,_xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffe20;
  batch_bool<float,_xsimd::fma3<xsimd::avx2>_> local_100 [2];
  batch_bool<float,_xsimd::fma3<xsimd::avx2>_> local_c0;
  long local_90;
  
  val = (float)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  sVar3.data = (register_type)ZEXT432(*(uint *)(in_RSI + 0x78));
  local_90 = in_RSI;
  xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffe20,val);
  xsimd::operator>=((batch<float,_xsimd::fma3<xsimd::avx2>_> *)in_stack_fffffffffffffdf0,
                    in_stack_fffffffffffffde8);
  sVar4.data = (register_type)ZEXT432(*(uint *)(local_90 + 0x7c));
  local_c0.super_get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data =
       (get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>)
       (get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>)sVar3.data;
  xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffe20,val);
  xsimd::operator<=((batch<float,_xsimd::fma3<xsimd::avx2>_> *)in_stack_fffffffffffffdf0,
                    in_stack_fffffffffffffde8);
  local_100[0].super_get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data =
       (get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>)
       (get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>)sVar4.data;
  bVar1 = xsimd::all<float,xsimd::fma3<xsimd::avx2>>(&local_c0);
  if (bVar1) {
    xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffe20,val);
    pbVar2 = extraout_RAX;
  }
  else {
    bVar1 = xsimd::all<float,xsimd::fma3<xsimd::avx2>>(local_100);
    if (bVar1) {
      xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffe20,val);
      pbVar2 = extraout_RAX_00;
    }
    else {
      xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffe20,val);
      xsimd::acos<float,xsimd::fma3<xsimd::avx2>>
                ((batch<float,_xsimd::fma3<xsimd::avx2>_> *)in_stack_fffffffffffffdf0);
      xsimd::operator*(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffe20,val);
      xsimd::operator+(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffe20,val);
      xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffe20,val);
      xsimd::select<float,xsimd::fma3<xsimd::avx2>>
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      pbVar2 = xsimd::select<float,xsimd::fma3<xsimd::avx2>>
                         (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                          in_stack_fffffffffffffde0);
    }
  }
  return pbVar2;
}

Assistant:

batch weight_from_cos(PolarExtentCoreContext &ctx, batch cos_angle) const {
      auto start = cos_angle >= ctx.cos_start_angle;
      auto end = cos_angle <= ctx.cos_end_angle;
      if (xsimd::all(start)) return batch{1.0};
      if (xsimd::all(end)) return batch{0.0};

      auto ramp = ctx.m * xsimd::acos(cos_angle) + ctx.c;
      return xsimd::select(start, batch{1.0},
                           xsimd::select(end, batch{0.0}, ramp));
    }